

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,SkelRoot *root,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  uint indent_00;
  string *psVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar4;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  uint32_t in_R9D;
  uint indent_01;
  pprint *ppVar6;
  stringstream ss;
  string local_218;
  string local_1f8;
  uint32_t local_1d4;
  pprint *local_1d0;
  string *local_1c8;
  ListEditQual local_1bc;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d4 = indent;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)root & 0xffffffff),n);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  to_string_abi_cxx11_(&local_1f8,(tinyusdz *)(ulong)*(uint *)(this + 0xc0),s);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," SkelRoot \"",0xb);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)(this + 0xa0),*(long *)(this + 0xa8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  bVar1 = PrimMetas::authored((PrimMetas *)(this + 3000));
  uVar4 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)root & 0xffffffff),n_00);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_(&local_218,this + 3000,(PrimMeta *)(ulong)((int)root + 1),indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    uVar4 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      uVar4 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)root & 0xffffffff),uVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    uVar4 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      uVar4 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)root & 0xffffffff),uVar4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"visibility","");
  indent_01 = (int)root + 1;
  local_1d0 = (pprint *)((ulong)root & 0xffffffff);
  print_typed_token_attr<tinyusdz::Visibility>
            (&local_218,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
             (this + 0x580),&local_1f8,indent_01);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"purpose","");
  print_typed_token_attr<tinyusdz::Purpose>
            (&local_218,(TypedAttributeWithFallback<tinyusdz::Purpose> *)(this + 0x348),&local_1f8,
             indent_01);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"extent","");
  indent_00 = indent_01;
  print_typed_attr<tinyusdz::Extent>
            (&local_218,(TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)(this + 0xd0),
             &local_1f8,indent_01);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  ppVar6 = local_1d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (this[0x808] == (tinyusdz)0x1) {
    local_1bc = *(ListEditQual *)(this + 0x900);
    psVar3 = &local_1f8;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1c8 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,"proxyPrim","");
    anon_unknown_173::print_relationship
              (&local_218,(Relationship *)(this + 0x810),&local_1bc,SUB81(psVar3,0),
               (string *)(ulong)indent_01,in_R9D);
    indent_00 = (uint)psVar3;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ = local_1c8;
    ppVar6 = local_1d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      __return_storage_ptr__ = local_1c8;
      ppVar6 = local_1d0;
    }
  }
  paVar5 = &local_218.field_2;
  print_xformOps_abi_cxx11_
            (&local_218,this,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)indent_01,
             indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar5) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  print_props(&local_218,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0xb88),indent_01);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  uVar4 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar5) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    uVar4 = extraout_EDX_04;
  }
  if ((char)local_1d4 != '\0') {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)ppVar6 & 0xffffffff),uVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar5) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const SkelRoot &root, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(root.spec) << " SkelRoot \""
     << root.name << "\"\n";
  if (root.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(root.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_token_attr(root.visibility, "visibility", indent + 1);
  ss << print_typed_token_attr(root.purpose, "purpose", indent + 1);
  ss << print_typed_attr(root.extent, "extent", indent + 1);

  if (root.proxyPrim) {
    ss << print_relationship(root.proxyPrim.value(),
                             root.proxyPrim.value().get_listedit_qual(),
                             /* custom */ false, "proxyPrim", indent + 1);
  }

  // TODO
  // Skeleton id
  // ss << pprint::Indent(indent) << "skelroot.skeleton_id << "\n"

  ss << print_xformOps(root.xformOps, indent + 1);

  ss << print_props(root.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}